

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dna_string.hpp
# Opt level: O2

void __thiscall dna_string::dna_string(dna_string *this,string *path,char TERM)

{
  pointer puVar1;
  ulong uVar2;
  uint uVar3;
  uint64_t uVar4;
  ulong uVar5;
  ostream *poVar6;
  undefined7 in_register_00000011;
  size_type __n;
  char *pcVar7;
  ostream *poVar8;
  char c;
  undefined4 local_28c;
  string BUF;
  string local_258;
  ifstream ifs;
  
  (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nbytes = 0;
  (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->superblock_ranks).super__Vector_base<p_rank,_std::allocator<p_rank>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->data = (uint8_t *)0x0;
  (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->n_superblocks = 0;
  this->n_blocks = 0;
  this->n = 0;
  local_28c = (undefined4)CONCAT71(in_register_00000011,TERM);
  this->TERM = TERM;
  std::__cxx11::string::string((string *)&local_258,(string *)path);
  uVar4 = filesize(&local_258);
  this->n = uVar4;
  std::__cxx11::string::~string((string *)&local_258);
  uVar5 = this->n + 1;
  __n = ((uVar5 >> 0x20) + 1) - (ulong)((int)uVar5 == 0);
  uVar4 = ((uVar5 >> 7) + 1) - (ulong)((uVar5 & 0x7f) == 0);
  this->n_superblocks = __n;
  this->n_blocks = uVar4;
  this->nbytes = uVar4 * 0x40;
  std::vector<p_rank,_std::allocator<p_rank>_>::vector
            ((vector<p_rank,_std::allocator<p_rank>_> *)&ifs,__n,(allocator_type *)&BUF);
  std::vector<p_rank,_std::allocator<p_rank>_>::_M_move_assign(&this->superblock_ranks,&ifs);
  std::_Vector_base<p_rank,_std::allocator<p_rank>_>::~_Vector_base
            ((_Vector_base<p_rank,_std::allocator<p_rank>_> *)&ifs);
  BUF._M_dataplus._M_p = BUF._M_dataplus._M_p & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ifs,this->nbytes + 0x40,
             (value_type_conflict1 *)&BUF,(allocator_type *)&c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign(&this->memory,&ifs);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&ifs);
  puVar1 = (this->memory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->data = puVar1 + (-(int)puVar1 & 0x3f);
  std::ifstream::ifstream(&ifs,(string *)path,_S_in);
  BUF._M_dataplus._M_p = (pointer)&BUF.field_2;
  std::__cxx11::string::_M_construct((ulong)&BUF,-0x80);
  uVar5 = 0;
  while( true ) {
    uVar2 = this->n;
    if (uVar2 <= uVar5) {
      if ((uVar2 & 0x7f) != 0) {
        set(this,uVar2 >> 7,&BUF);
      }
      std::__cxx11::string::~string((string *)&BUF);
      std::ifstream::~ifstream(&ifs);
      build_rank_support(this);
      return;
    }
    std::istream::read((char *)&ifs,(long)&c);
    uVar3 = (uint)uVar5 & 0x7f;
    BUF._M_dataplus._M_p[uVar3] = c;
    if (((0x13 < (byte)c - 0x41) || ((0x80045U >> ((byte)c - 0x41 & 0x1f) & 1) == 0)) &&
       (c != (char)local_28c)) break;
    if (uVar3 == 0x7f) {
      set(this,uVar5 >> 7,&BUF);
    }
    uVar5 = uVar5 + 1;
  }
  poVar6 = std::operator<<((ostream *)&std::cout,
                           "Error while reading file: read forbidden character \'");
  poVar6 = std::operator<<(poVar6,c);
  poVar6 = std::operator<<(poVar6,"\' (ASCII code ");
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(int)c);
  poVar6 = std::operator<<(poVar6,").");
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar8 = (ostream *)&std::cout;
  poVar6 = std::operator<<((ostream *)&std::cout,"Only A,C,G,T, and ");
  poVar6 = std::operator<<(poVar6,(char)local_28c);
  poVar6 = std::operator<<(poVar6," are admitted in the input BWT!");
  std::endl<char,std::char_traits<char>>(poVar6);
  if (c == 'N') {
    pcVar7 = 
    "Possible solution: it seems that your file contains \'N\' characters. Please, re-run with option -n."
    ;
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "Possible solution: if the unknown character is the terminator, you can solve the problem by adding option \"-t "
                            );
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(int)c);
    pcVar7 = "\".";
  }
  poVar6 = std::operator<<(poVar8,pcVar7);
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(1);
}

Assistant:

dna_string(string path, char TERM = '#'){

		this->TERM = TERM;

		n = uint64_t(filesize(path));

		n_superblocks = (n+1)/SUPERBLOCK_SIZE + ((n+1)%SUPERBLOCK_SIZE != 0);
		n_blocks = (n+1)/BLOCK_SIZE + ((n+1)%BLOCK_SIZE != 0);
		nbytes = (n_blocks * BYTES_PER_BLOCK);//number of bytes effectively filled with data

		superblock_ranks = vector<p_rank>(n_superblocks);

		/*
		 * this block of code ensures that data is aligned by 64 bytes = 512 bits
		 */
		memory = vector<uint8_t>(nbytes+ALN,0);
		data = memory.data();
		while(uint64_t(data) % ALN != 0) data++;

		//cout << "alignment of data: " << (void*)data << endl;

		{

			ifstream ifs(path);

			string BUF(BLOCK_SIZE,'A');

			for(uint64_t i = 0; i<n; ++i){

				char c;

				ifs.read((char*)&c, sizeof(char));

				BUF[i%BLOCK_SIZE] = c;

				if(c!='A' and c!='C' and c!='G' and c!='T' and c!=TERM){
					cout << "Error while reading file: read forbidden character '" <<  c << "' (ASCII code " << int(c) << ")." << endl;
					cout << "Only A,C,G,T, and " << TERM << " are admitted in the input BWT!" << endl;

					if(c=='N'){

						cout << "Possible solution: it seems that your file contains 'N' characters. Please, re-run with option -n." << endl;

					}else{

						cout << "Possible solution: if the unknown character is the terminator, you can solve the problem by adding option \"-t " << int(c) << "\"." << endl;

					}

					exit(1);
				}

				//buffer is full
				if((i%BLOCK_SIZE) == BLOCK_SIZE-1) set(i/BLOCK_SIZE, BUF);

			}

			if(n % BLOCK_SIZE != 0) set(n/BLOCK_SIZE, BUF);

		}

		assert(check_content(path));
		build_rank_support();

	}